

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

void Diffusion::computeAlpha
               (MultiFab *alpha,pair<double,_double> *scalars,Real a,Real b,Real *rhsscale,
               MultiFab *alpha_in,int alpha_in_comp,int rho_flag,MultiFab *rho,int rho_comp)

{
  Real RVar1;
  BoxArray *pBVar2;
  long in_RCX;
  double *in_RDX;
  double *in_RSI;
  long *in_RDI;
  int in_R9D;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  FabArrayBase *in_stack_00000008;
  FabFactory<amrex::FArrayBox> *factory;
  DistributionMapping *dm;
  BoxArray *ba;
  undefined1 in_stack_00000247;
  int in_stack_00000248;
  int in_stack_0000024c;
  MultiFab *in_stack_00000250;
  FabFactory<amrex::FArrayBox> *val;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffff50;
  double dVar3;
  DistributionMapping *pDVar4;
  undefined8 *puVar5;
  MultiFab *in_stack_ffffffffffffff78;
  MultiFab *in_stack_ffffffffffffff80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  FabFactory<amrex::FArrayBox> *local_50;
  DistributionMapping *local_48;
  BoxArray *local_40;
  int local_38;
  long local_30;
  double *local_28;
  double local_20;
  double local_18;
  double *local_10;
  long *local_8;
  
  local_18 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_20 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_38 = in_R9D;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_40 = amrex::FabArrayBase::boxArray(in_stack_00000008);
  local_48 = amrex::FabArrayBase::DistributionMap(in_stack_00000008);
  local_50 = amrex::FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x862ac9);
  pBVar2 = local_40;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_58 = 0;
  puVar5 = &local_78;
  pDVar4 = local_48;
  amrex::MFInfo::MFInfo((MFInfo *)0x862b14);
  val = local_50;
  (**(code **)(*local_8 + 0x10))(local_8,pBVar2,pDVar4,1,0,puVar5);
  amrex::MFInfo::~MFInfo((MFInfo *)0x862b50);
  if (local_30 == 0) {
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffff50,(value_type)val);
  }
  else {
    amrex::MultiFab::Copy
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(int)((ulong)puVar5 >> 0x20),
               (int)puVar5,(int)((ulong)pDVar4 >> 0x20),(int)pDVar4);
  }
  if (0 < local_38) {
    amrex::MultiFab::Multiply
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(int)((ulong)puVar5 >> 0x20),
               (int)puVar5,(int)((ulong)pDVar4 >> 0x20),(int)pDVar4);
  }
  if (local_28 == (double *)0x0) {
    *local_10 = local_18;
    local_10[1] = local_20;
  }
  else {
    if (scale_abec == 0) {
      dVar3 = 1.0;
    }
    else {
      RVar1 = amrex::MultiFab::max
                        (in_stack_00000250,in_stack_0000024c,in_stack_00000248,
                         (bool)in_stack_00000247);
      dVar3 = 1.0 / RVar1;
    }
    *local_28 = dVar3;
    *local_10 = local_18 * *local_28;
    local_10[1] = local_20 * *local_28;
  }
  return;
}

Assistant:

void
Diffusion::computeAlpha (MultiFab&             alpha,
                         std::pair<Real,Real>& scalars,
                         Real                  a,
                         Real                  b,
                         Real*                 rhsscale,
                         const MultiFab*       alpha_in,
                         int                   alpha_in_comp,
                         int                   rho_flag,
                         const MultiFab*       rho,
                         int                   rho_comp)
{
    const BoxArray& ba = rho->boxArray();
    const DistributionMapping& dm = rho->DistributionMap();
    const auto& factory = rho->Factory();

    alpha.define(ba, dm, 1, 0, MFInfo(), factory);

    if (alpha_in != 0)
    {
        BL_ASSERT(alpha_in_comp >= 0 && alpha_in_comp < alpha.nComp());
        MultiFab::Copy(alpha,*alpha_in,alpha_in_comp,0,1,0);
    }
    else
      alpha.setVal(1.0);

    if ( rho_flag > 0 )
    {
        MultiFab::Multiply(alpha,*rho,rho_comp,0,1,0);
    }

    if (rhsscale != 0)
    {
        *rhsscale = scale_abec ? 1.0/alpha.max(0) : 1.0;

        scalars.first = a*(*rhsscale);
        scalars.second = b*(*rhsscale);
    }
    else
    {
        scalars.first = a;
        scalars.second = b;
    }
}